

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

void add_one_insn(dmr_C *C,entrypoint *ep,instruction *insn)

{
  basic_block *pbVar1;
  
  pbVar1 = ep->active;
  if (pbVar1 != (basic_block *)0x0) {
    insn->bb = pbVar1;
    ptrlist_add((ptr_list **)&pbVar1->insns,insn,&C->ptrlist_allocator);
    return;
  }
  return;
}

Assistant:

static void add_one_insn(struct dmr_C *C, struct entrypoint *ep, struct instruction *insn)
{
	struct basic_block *bb = ep->active;    

	if (dmrC_bb_reachable(bb)) {
		insn->bb = bb;
		dmrC_add_instruction(C, &bb->insns, insn);
	}
}